

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_insert_elim_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::DeadInsertElimPass::EliminateDeadInserts(DeadInsertElimPass *this,Function *func)

{
  bool bVar1;
  undefined1 local_1a;
  bool lastmodified;
  bool modified;
  Function *func_local;
  DeadInsertElimPass *this_local;
  
  bVar1 = false;
  local_1a = true;
  while (local_1a != false) {
    local_1a = EliminateDeadInsertsOnePass(this,func);
    bVar1 = bVar1 != false || local_1a;
  }
  return bVar1;
}

Assistant:

bool DeadInsertElimPass::EliminateDeadInserts(Function* func) {
  bool modified = false;
  bool lastmodified = true;
  // Each pass can delete dead instructions, thus potentially revealing
  // new dead insertions ie insertions with no uses.
  while (lastmodified) {
    lastmodified = EliminateDeadInsertsOnePass(func);
    modified |= lastmodified;
  }
  return modified;
}